

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

vector<double> * __thiscall
mat_lib::vector<double>::operator*
          (vector<double> *__return_storage_ptr__,vector<double> *this,element_t rhs)

{
  size_t sVar1;
  reference pvVar2;
  int local_28;
  int i;
  element_t rhs_local;
  vector<double> *this_local;
  vector<double> *res;
  
  sVar1 = size(this);
  vector(__return_storage_ptr__,sVar1);
  for (local_28 = 0; sVar1 = size(this), (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->container__,(long)local_28);
    set(__return_storage_ptr__,(long)local_28,*pvVar2 * rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

vector operator*(const element_t rhs){
          vector<element_t> res(this->size());

          for (int i = 0; i < this->size(); ++i) {
              res.set(i,container__[i] * rhs);
          }

          return res;
      }